

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_restoration(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int sn_00;
  int sn_01;
  int sn_02;
  int sn_03;
  CHAR_DATA *in_RCX;
  bool success;
  int sn_prevent_healing;
  int sn_drain;
  int sn_wither;
  int sn_forget;
  CHAR_DATA *victim;
  void *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint3 in_stack_ffffffffffffffc4;
  uint sn_04;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  sn_04 = (uint)in_stack_ffffffffffffffc4;
  sn_00 = skill_lookup((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  sn_01 = skill_lookup((char *)CONCAT44(in_stack_ffffffffffffffcc,sn_00));
  sn_02 = skill_lookup((char *)CONCAT44(in_stack_ffffffffffffffcc,sn_00));
  sn_03 = skill_lookup((char *)CONCAT44(in_stack_ffffffffffffffcc,sn_00));
  bVar1 = is_affected(in_RCX,sn_01);
  if (bVar1) {
    send_to_char((char *)CONCAT44(sn_01,sn_02),(CHAR_DATA *)CONCAT44(sn_03,sn_00));
    act((char *)CONCAT44(sn_01,sn_02),(CHAR_DATA *)CONCAT44(sn_03,sn_00),
        (void *)CONCAT44(sn_04,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,0);
    affect_strip((CHAR_DATA *)CONCAT44(sn_01,sn_02),sn_03);
    sn_04 = CONCAT13(1,(int3)sn_04);
  }
  bVar1 = is_affected(in_RCX,sn_02);
  if (bVar1) {
    send_to_char((char *)CONCAT44(sn_01,sn_02),(CHAR_DATA *)CONCAT44(sn_03,sn_00));
    act((char *)CONCAT44(sn_01,sn_02),(CHAR_DATA *)CONCAT44(sn_03,sn_00),
        (void *)CONCAT44(sn_04,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,0);
    affect_strip((CHAR_DATA *)CONCAT44(sn_01,sn_02),sn_03);
    sn_04 = CONCAT13(1,(int3)sn_04);
  }
  bVar1 = is_affected(in_RCX,sn_00);
  if (bVar1) {
    send_to_char((char *)CONCAT44(sn_01,sn_02),(CHAR_DATA *)CONCAT44(sn_03,sn_00));
    act((char *)CONCAT44(sn_01,sn_02),(CHAR_DATA *)CONCAT44(sn_03,sn_00),
        (void *)CONCAT44(sn_04,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,0);
    affect_strip((CHAR_DATA *)CONCAT44(sn_01,sn_02),sn_03);
    sn_04 = CONCAT13(1,(int3)sn_04);
  }
  bVar1 = is_affected(in_RCX,(int)gsn_atrophy);
  if (bVar1) {
    act((char *)CONCAT44(sn_01,sn_02),(CHAR_DATA *)CONCAT44(sn_03,sn_00),
        (void *)CONCAT44(sn_04,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,0);
    send_to_char((char *)CONCAT44(sn_01,sn_02),(CHAR_DATA *)CONCAT44(sn_03,sn_00));
    affect_strip((CHAR_DATA *)CONCAT44(sn_01,sn_02),sn_03);
  }
  bVar1 = is_affected(in_RCX,sn_03);
  if ((bVar1) && (bVar1 = check_dispel(sn_02,(CHAR_DATA *)CONCAT44(sn_03,sn_00),sn_04), bVar1)) {
    act((char *)CONCAT44(sn_01,sn_02),(CHAR_DATA *)CONCAT44(sn_03,sn_00),
        (void *)CONCAT44(sn_04,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,0);
    affect_strip((CHAR_DATA *)CONCAT44(sn_01,sn_02),sn_03);
    sn_04 = 0x1000000;
  }
  if ((sn_04 & 0x1000000) == 0) {
    send_to_char((char *)CONCAT44(sn_01,sn_02),(CHAR_DATA *)CONCAT44(sn_03,sn_00));
  }
  return;
}

Assistant:

void spell_restoration(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int sn_forget, sn_wither, sn_drain, sn_prevent_healing;
	bool success = false;

	sn_prevent_healing = skill_lookup("prevent healing");
	sn_forget = skill_lookup("forget");
	sn_wither = skill_lookup("wither");
	sn_drain = skill_lookup("undead drain");

	if (is_affected(victim, sn_forget))
	{
		send_to_char("You feel your mind becoming clearer.\n\r", victim);
		act("$n looks less confused.", victim, 0, 0, TO_ROOM);
		affect_strip(victim, sn_forget);
		success = true;
	}

	if (is_affected(victim, sn_wither))
	{
		send_to_char("Your emaciated body is restored.\n\r", victim);
		act("$n's emaciated body looks healthier.", victim, 0, 0, TO_ROOM);
		affect_strip(victim, sn_wither);
		success = true;
	}

	if (is_affected(victim, sn_prevent_healing))
	{
		send_to_char("You no longer feel so sickly and weary.\n\r", victim);
		act("$n's sickly complexion clears up.", victim, nullptr, nullptr, TO_ROOM);
		affect_strip(victim, sn_prevent_healing);
		success = true;
	}

	if (is_affected(victim, gsn_atrophy))
	{
		act("$n's body stops wasting away.", victim, 0, 0, TO_ROOM);
		send_to_char("Your body stops wasting away.\n\r", victim);
		affect_strip(victim, gsn_atrophy);
	}

	if (is_affected(victim, sn_drain) && check_dispel(level + 15, victim, sn_drain))
	{
		act("$n looks much better.", victim, nullptr, nullptr, TO_ROOM);
		affect_strip(victim, sn_drain);
		success = true;
	}

	if (!success)
		send_to_char("Spell had no effect.\n\r", ch);
}